

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Geodesic.cpp
# Opt level: O1

Geodesic *
Geodesic::getGeodesicNoCommonEdges(Geodesic *__return_storage_ptr__,PhyloTree *t1,PhyloTree *t2)

{
  vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *edges2;
  vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *edges1;
  pointer pPVar1;
  pointer pPVar2;
  pointer pPVar3;
  unsigned_long uVar4;
  pointer puVar5;
  long lVar6;
  RatioSequence *pRVar7;
  pointer puVar8;
  undefined8 uVar9;
  vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *pvVar10;
  __normal_iterator<PhyloTreeEdge_*,_std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>_>
  _Var11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr___00;
  long *plVar12;
  ulong uVar13;
  deque<bool,_std::allocator<bool>_> *pdVar14;
  PhyloTreeEdge *ratio_e_edge;
  long lVar15;
  pointer pPVar16;
  size_type sVar17;
  ulong uVar18;
  int i;
  pointer puVar19;
  PhyloTree *this;
  int iVar20;
  vector<unsigned_long,_std::allocator<unsigned_long>_> aVertices;
  vector<unsigned_long,_std::allocator<unsigned_long>_> bVertices;
  Ratio r1;
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  cover;
  Ratio ratio;
  RatioSequence rs;
  vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> ratio_e_edges;
  Ratio r2;
  deque<Ratio,_std::allocator<Ratio>_> queue;
  vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> ratio_f_edges;
  vector<std::deque<bool,_std::allocator<bool>_>,_std::allocator<std::deque<bool,_std::allocator<bool>_>_>_>
  incidenceMatrix;
  BipartiteGraph bg;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_2c8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_2a8;
  PhyloTree *local_290;
  Geodesic *local_288;
  Ratio local_280;
  ulong local_240;
  size_type local_238;
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  local_230;
  Ratio local_218;
  RatioSequence local_1d0;
  vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> local_1b0;
  Ratio local_198;
  undefined1 local_158 [32];
  _Elt_pointer local_138;
  _Map_pointer ppRStack_130;
  _Elt_pointer local_128;
  _Elt_pointer pRStack_120;
  _Elt_pointer local_118;
  _Map_pointer ppRStack_110;
  vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> local_100;
  vector<std::deque<bool,_std::allocator<bool>_>,_std::allocator<std::deque<bool,_std::allocator<bool>_>_>_>
  local_e8;
  undefined1 local_d0 [16];
  deque<bool,_std::allocator<bool>_> local_c0;
  Ratio local_70;
  
  pPVar1 = (t1->edges).super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>._M_impl.
           super__Vector_impl_data._M_start;
  pPVar16 = (t1->edges).super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>._M_impl.
            super__Vector_impl_data._M_finish;
  uVar18 = ((long)pPVar16 - (long)pPVar1 >> 3) * -0x71c71c71c71c71c7;
  pPVar2 = (t2->edges).super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>._M_impl.
           super__Vector_impl_data._M_start;
  pPVar3 = (t2->edges).super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>._M_impl.
           super__Vector_impl_data._M_finish;
  lVar15 = (long)pPVar3 - (long)pPVar2;
  sVar17 = (lVar15 >> 3) * -0x71c71c71c71c71c7;
  local_290 = t1;
  if (sVar17 == 0 && uVar18 == 0) {
    RatioSequence::RatioSequence((RatioSequence *)local_d0);
    Geodesic(__return_storage_ptr__,(RatioSequence *)local_d0);
    pRVar7 = (RatioSequence *)local_d0;
  }
  else {
    local_288 = __return_storage_ptr__;
    local_238 = sVar17;
    if ((pPVar16 == pPVar1) || (pPVar3 == pPVar2)) {
      __return_storage_ptr___00 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           __cxa_allocate_exception(0x20);
      PhyloTree::getNewick_abi_cxx11_((string *)&local_218,local_290,true);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_158,
                     "Error: tried to compute geodesic between subtrees that should not have common/compatible edges, but do!  t1 = "
                     ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      &local_218);
      plVar12 = (long *)std::__cxx11::string::append(local_158);
      local_d0._0_8_ = *plVar12;
      pdVar14 = (deque<bool,_std::allocator<bool>_> *)(plVar12 + 2);
      if ((deque<bool,_std::allocator<bool>_> *)local_d0._0_8_ == pdVar14) {
        local_c0.super__Deque_base<bool,_std::allocator<bool>_>._M_impl.super__Deque_impl_data.
        _M_map = (pdVar14->super__Deque_base<bool,_std::allocator<bool>_>)._M_impl.
                 super__Deque_impl_data._M_map;
        local_c0.super__Deque_base<bool,_std::allocator<bool>_>._M_impl.super__Deque_impl_data.
        _M_map_size = plVar12[3];
        local_d0._0_8_ = &local_c0;
      }
      else {
        local_c0.super__Deque_base<bool,_std::allocator<bool>_>._M_impl.super__Deque_impl_data.
        _M_map = (pdVar14->super__Deque_base<bool,_std::allocator<bool>_>)._M_impl.
                 super__Deque_impl_data._M_map;
      }
      local_d0._8_8_ = plVar12[1];
      *plVar12 = (long)pdVar14;
      plVar12[1] = 0;
      *(undefined1 *)(plVar12 + 2) = 0;
      PhyloTree::getNewick_abi_cxx11_((string *)&local_280,t2,true);
      std::operator+(__return_storage_ptr___00,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_280
                    );
      __cxa_throw(__return_storage_ptr___00,&std::__cxx11::string::typeinfo,
                  std::__cxx11::string::~string);
    }
    lVar6 = 0x3f;
    if (uVar18 != 0) {
      for (; uVar18 >> lVar6 == 0; lVar6 = lVar6 + -1) {
      }
    }
    local_240 = uVar18;
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<PhyloTreeEdge*,std::vector<PhyloTreeEdge,std::allocator<PhyloTreeEdge>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (pPVar1,pPVar16,((uint)lVar6 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<PhyloTreeEdge*,std::vector<PhyloTreeEdge,std::allocator<PhyloTreeEdge>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (pPVar1);
    pPVar2 = (t2->edges).super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>._M_impl.
             super__Vector_impl_data._M_start;
    pPVar3 = (t2->edges).super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (pPVar2 != pPVar3) {
      uVar18 = ((long)pPVar3 - (long)pPVar2 >> 3) * -0x71c71c71c71c71c7;
      lVar6 = 0x3f;
      if (uVar18 != 0) {
        for (; uVar18 >> lVar6 == 0; lVar6 = lVar6 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<PhyloTreeEdge*,std::vector<PhyloTreeEdge,std::allocator<PhyloTreeEdge>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                (pPVar2,pPVar3,((uint)lVar6 ^ 0x3f) * 2 ^ 0x7e);
      std::
      __final_insertion_sort<__gnu_cxx::__normal_iterator<PhyloTreeEdge*,std::vector<PhyloTreeEdge,std::allocator<PhyloTreeEdge>>>,__gnu_cxx::__ops::_Iter_less_iter>
                (pPVar2);
    }
    this = local_290;
    edges1 = &local_290->edges;
    edges2 = &t2->edges;
    RatioSequence::RatioSequence(&local_1d0);
    if ((long)pPVar16 - (long)pPVar1 == 0x48 || lVar15 == 0x48) {
      Ratio::Ratio(&local_70,edges1,edges2);
      __return_storage_ptr__ = local_288;
      RatioSequence::push_back_value(&local_1d0,&local_70);
      std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::~vector(&local_70.fEdges);
      std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::~vector(&local_70.eEdges);
      Geodesic(__return_storage_ptr__,&local_1d0);
    }
    else {
      local_2c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start = (unsigned_long *)0x0;
      local_2c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = (unsigned_long *)0x0;
      local_2c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (unsigned_long *)0x0;
      local_2a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (unsigned_long *)0x0;
      local_2a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start = (unsigned_long *)0x0;
      local_2a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = (unsigned_long *)0x0;
      local_118 = (_Elt_pointer)0x0;
      ppRStack_110 = (_Map_pointer)0x0;
      local_128 = (_Elt_pointer)0x0;
      pRStack_120 = (_Elt_pointer)0x0;
      local_138 = (_Elt_pointer)0x0;
      ppRStack_130 = (_Map_pointer)0x0;
      local_158._16_8_ = (_Elt_pointer)0x0;
      local_158._24_8_ = (_Elt_pointer)0x0;
      local_158._0_8_ = (_Map_pointer)0x0;
      local_158._8_8_ = 0;
      std::_Deque_base<Ratio,_std::allocator<Ratio>_>::_M_initialize_map
                ((_Deque_base<Ratio,_std::allocator<Ratio>_> *)local_158,0);
      Ratio::Ratio(&local_218);
      BipartiteGraph::getIncidenceMatrix(&local_e8,edges1,edges2);
      PhyloTree::getIntEdgeAttribNorms((vector<double,_std::allocator<double>_> *)&local_280,this);
      PhyloTree::getIntEdgeAttribNorms((vector<double,_std::allocator<double>_> *)&local_198,t2);
      BipartiteGraph::BipartiteGraph
                ((BipartiteGraph *)local_d0,&local_e8,
                 (vector<double,_std::allocator<double>_> *)&local_280,
                 (vector<double,_std::allocator<double>_> *)&local_198);
      if ((void *)local_198.eLength != (void *)0x0) {
        operator_delete((void *)local_198.eLength);
      }
      if ((void *)local_280.eLength != (void *)0x0) {
        operator_delete((void *)local_280.eLength);
      }
      std::deque<Ratio,std::allocator<Ratio>>::
      emplace_back<std::vector<PhyloTreeEdge,std::allocator<PhyloTreeEdge>>&,std::vector<PhyloTreeEdge,std::allocator<PhyloTreeEdge>>&>
                ((deque<Ratio,std::allocator<Ratio>> *)local_158,edges1,edges2);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve(&local_2c8,local_240);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve(&local_2a8,local_238);
      if (local_128 != (_Elt_pointer)local_158._16_8_) {
        do {
          uVar9 = local_158._16_8_;
          local_218.eLength = *(double *)local_158._16_8_;
          local_218.fLength = *(double *)(local_158._16_8_ + 8);
          std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::operator=
                    (&local_218.eEdges,
                     (vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *)
                     (local_158._16_8_ + 0x10));
          std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::operator=
                    (&local_218.fEdges,
                     (vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *)(uVar9 + 0x28));
          std::deque<Ratio,_std::allocator<Ratio>_>::pop_front
                    ((deque<Ratio,_std::allocator<Ratio>_> *)local_158);
          if (local_2c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_finish !=
              local_2c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start) {
            local_2c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_2c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                 .super__Vector_impl_data._M_start;
          }
          if (local_2a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_finish !=
              local_2a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start) {
            local_2a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_2a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                 .super__Vector_impl_data._M_start;
          }
          pvVar10 = Ratio::getEEdges(&local_218);
          std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::vector(&local_1b0,pvVar10);
          pvVar10 = Ratio::getFEdges(&local_218);
          std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::vector(&local_100,pvVar10);
          pPVar1 = local_1b0.super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
          for (pPVar16 = local_1b0.super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>
                         ._M_impl.super__Vector_impl_data._M_start; pPVar16 != pPVar1;
              pPVar16 = pPVar16 + 1) {
            _Var11 = std::
                     __lower_bound<__gnu_cxx::__normal_iterator<PhyloTreeEdge*,std::vector<PhyloTreeEdge,std::allocator<PhyloTreeEdge>>>,PhyloTreeEdge,__gnu_cxx::__ops::_Iter_less_val>
                               ((this->edges).
                                super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>.
                                _M_impl.super__Vector_impl_data._M_start,
                                (this->edges).
                                super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>.
                                _M_impl.super__Vector_impl_data._M_finish,pPVar16);
            local_280.eLength =
                 (double)(((long)_Var11._M_current -
                           (long)(edges1->
                                 super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>).
                                 _M_impl.super__Vector_impl_data._M_start >> 3) *
                         -0x71c71c71c71c71c7);
            if (local_2c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_finish ==
                local_2c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
              _M_realloc_insert<unsigned_long>
                        (&local_2c8,
                         (iterator)
                         local_2c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                         ._M_impl.super__Vector_impl_data._M_finish,(unsigned_long *)&local_280);
            }
            else {
              *local_2c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish = (unsigned_long)local_280.eLength;
              local_2c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   local_2c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_finish + 1;
            }
          }
          lVar15 = 0;
          for (uVar18 = 0; pvVar10 = Ratio::getFEdges(&local_218),
              uVar13 = ((long)(pvVar10->
                              super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>).
                              _M_impl.super__Vector_impl_data._M_finish -
                        (long)(pvVar10->
                              super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>).
                              _M_impl.super__Vector_impl_data._M_start >> 3) * -0x71c71c71c71c71c7,
              uVar18 <= uVar13 && uVar13 - uVar18 != 0; uVar18 = uVar18 + 1) {
            _Var11 = std::
                     __lower_bound<__gnu_cxx::__normal_iterator<PhyloTreeEdge*,std::vector<PhyloTreeEdge,std::allocator<PhyloTreeEdge>>>,PhyloTreeEdge,__gnu_cxx::__ops::_Iter_less_val>
                               ((t2->edges).
                                super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>.
                                _M_impl.super__Vector_impl_data._M_start,
                                (t2->edges).
                                super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>.
                                _M_impl.super__Vector_impl_data._M_finish,
                                (long)&((local_100.
                                         super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->
                                       super_Bipartition)._vptr_Bipartition + lVar15);
            local_280.eLength =
                 (double)(((long)_Var11._M_current -
                           (long)(edges2->
                                 super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>).
                                 _M_impl.super__Vector_impl_data._M_start >> 3) *
                         -0x71c71c71c71c71c7);
            if (local_2a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_finish ==
                local_2a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
              _M_realloc_insert<unsigned_long>
                        (&local_2a8,
                         (iterator)
                         local_2a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                         ._M_impl.super__Vector_impl_data._M_finish,(unsigned_long *)&local_280);
            }
            else {
              *local_2a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish = (unsigned_long)local_280.eLength;
              local_2a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   local_2a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_finish + 1;
            }
            lVar15 = lVar15 + 0x48;
          }
          BipartiteGraph::vertex_cover(&local_230,(BipartiteGraph *)local_d0,&local_2c8,&local_2a8);
          this = local_290;
          uVar4 = *((local_230.
                     super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          if ((uVar4 == 0) ||
             (uVar4 == (long)local_2c8.
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                       (long)local_2c8.
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_start >> 3)) {
            RatioSequence::push_back(&local_1d0,&local_218);
          }
          else {
            Ratio::Ratio(&local_280);
            Ratio::Ratio(&local_198);
            puVar8 = local_2c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_finish;
            if (local_2c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start !=
                local_2c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_finish) {
              iVar20 = 0;
              puVar19 = local_2c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_start;
              do {
                uVar4 = *puVar19;
                puVar5 = local_230.
                         super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[2].
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_start;
                if (((ulong)(long)iVar20 <
                     (ulong)((long)local_230.
                                   super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start[2].
                                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)puVar5 >> 3))
                   && (uVar4 == puVar5[iVar20])) {
                  Ratio::addEEdge(&local_280,
                                  (edges1->
                                  super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>)
                                  ._M_impl.super__Vector_impl_data._M_start + uVar4);
                  iVar20 = iVar20 + 1;
                }
                else {
                  Ratio::addEEdge(&local_198,
                                  (edges1->
                                  super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>)
                                  ._M_impl.super__Vector_impl_data._M_start + uVar4);
                }
                puVar19 = puVar19 + 1;
              } while (puVar19 != puVar8);
            }
            puVar8 = local_2a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_finish;
            if (local_2a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start !=
                local_2a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_finish) {
              iVar20 = 0;
              puVar19 = local_2a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_start;
              do {
                uVar4 = *puVar19;
                puVar5 = local_230.
                         super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[3].
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_start;
                if (((ulong)(long)iVar20 <
                     (ulong)((long)local_230.
                                   super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start[3].
                                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)puVar5 >> 3))
                   && (uVar4 == puVar5[iVar20])) {
                  Ratio::addFEdge(&local_198,
                                  (edges2->
                                  super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>)
                                  ._M_impl.super__Vector_impl_data._M_start + uVar4);
                  iVar20 = iVar20 + 1;
                }
                else {
                  Ratio::addFEdge(&local_280,
                                  (edges2->
                                  super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>)
                                  ._M_impl.super__Vector_impl_data._M_start + uVar4);
                }
                puVar19 = puVar19 + 1;
              } while (puVar19 != puVar8);
            }
            std::deque<Ratio,_std::allocator<Ratio>_>::push_front
                      ((deque<Ratio,_std::allocator<Ratio>_> *)local_158,&local_198);
            std::deque<Ratio,_std::allocator<Ratio>_>::push_front
                      ((deque<Ratio,_std::allocator<Ratio>_> *)local_158,&local_280);
            std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::~vector(&local_198.fEdges);
            std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::~vector(&local_198.eEdges);
            std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::~vector(&local_280.fEdges);
            std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::~vector(&local_280.eEdges);
            this = local_290;
          }
          std::
          vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
          ::~vector(&local_230);
          std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::~vector(&local_100);
          std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::~vector(&local_1b0);
        } while (local_128 != (_Elt_pointer)local_158._16_8_);
      }
      __return_storage_ptr__ = local_288;
      Geodesic(local_288,&local_1d0);
      if ((pointer)local_c0.super__Deque_base<bool,_std::allocator<bool>_>._M_impl.
                   super__Deque_impl_data._M_finish._M_first != (pointer)0x0) {
        operator_delete(local_c0.super__Deque_base<bool,_std::allocator<bool>_>._M_impl.
                        super__Deque_impl_data._M_finish._M_first);
      }
      if ((pointer)local_c0.super__Deque_base<bool,_std::allocator<bool>_>._M_impl.
                   super__Deque_impl_data._M_start._M_last != (pointer)0x0) {
        operator_delete(local_c0.super__Deque_base<bool,_std::allocator<bool>_>._M_impl.
                        super__Deque_impl_data._M_start._M_last);
      }
      std::
      vector<std::deque<bool,_std::allocator<bool>_>,_std::allocator<std::deque<bool,_std::allocator<bool>_>_>_>
      ::~vector((vector<std::deque<bool,_std::allocator<bool>_>,_std::allocator<std::deque<bool,_std::allocator<bool>_>_>_>
                 *)local_d0);
      std::
      vector<std::deque<bool,_std::allocator<bool>_>,_std::allocator<std::deque<bool,_std::allocator<bool>_>_>_>
      ::~vector(&local_e8);
      std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::~vector(&local_218.fEdges);
      std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::~vector(&local_218.eEdges);
      std::deque<Ratio,_std::allocator<Ratio>_>::~deque
                ((deque<Ratio,_std::allocator<Ratio>_> *)local_158);
      if (local_2a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start != (unsigned_long *)0x0) {
        operator_delete(local_2a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_2c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start != (unsigned_long *)0x0) {
        operator_delete(local_2c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
    }
    pRVar7 = &local_1d0;
  }
  std::vector<Ratio,_std::allocator<Ratio>_>::~vector(&pRVar7->_RatioSequence);
  return __return_storage_ptr__;
}

Assistant:

Geodesic Geodesic::getGeodesicNoCommonEdges(PhyloTree &t1, PhyloTree &t2) {
    auto& t1_edges = t1.edges;
    auto& t2_edges = t2.edges;
    size_t numEdges1 = t1_edges.size(); // number of edges in tree 1
    size_t numEdges2 = t2_edges.size(); // number of edges in tree 2

    if (numEdges1 == 0 && numEdges2 == 0)
        return Geodesic(RatioSequence());

    // double-check that both trees have splits.  Otherwise didn't remove a common edge.
    if (numEdges1 == 0 || numEdges2 == 0) {
        throw ("Error: tried to compute geodesic between subtrees that should not have common/compatible edges, but do!  t1 = " + t1.getNewick(true) + " and t2 = " + t2.getNewick(true));
    }

    std::sort(t1_edges.begin(), t1_edges.end());
    std::sort(t2_edges.begin(), t2_edges.end());

    // double-check no common edges
//    vector<PhyloTreeEdge> commonEdges;
//    PhyloTree::getCommonEdges(t1_edges, t2_edges, commonEdges);
//    if (commonEdges.size() != 0) {
//        throw invalid_argument("Error: tried to compute geodesic between subtrees that should not have common edges, but do!  t1 = " + t1.getNewick(true) + " and t2 = " + t2.getNewick(true));
//    }

    auto rs = RatioSequence();
    // if we can't split the ratio because it has too few edges in either the numerator or denominator
    if ((numEdges1 == 1) || (numEdges2 == 1)) {
        rs.push_back_value(Ratio(t1_edges, t2_edges));
        return Geodesic(rs);
    }

    vector<size_t> aVertices, bVertices;
    deque<Ratio> queue;
    Ratio ratio;

    // initialize BipartiteGraph
    auto incidenceMatrix = BipartiteGraph::getIncidenceMatrix(t1_edges, t2_edges);
    BipartiteGraph bg(incidenceMatrix, t1.getIntEdgeAttribNorms(), t2.getIntEdgeAttribNorms());
    queue.emplace_back(t1_edges, t2_edges);
    aVertices.reserve(numEdges1);
    bVertices.reserve(numEdges2);

    while (!queue.empty()) {
        ratio = queue.front();
        queue.pop_front();
        aVertices.clear();
        bVertices.clear();

        // convert the ratio to what we pass to vertex cover
        auto ratio_e_edges = ratio.getEEdges();
        auto ratio_f_edges = ratio.getFEdges();
        for (const auto & ratio_e_edge : ratio_e_edges) {
            auto index_iter = std::lower_bound(t1_edges.begin(), t1_edges.end(), ratio_e_edge);
            aVertices.push_back(std::distance(t1_edges.begin(), index_iter));
        }

        for (int i = 0; i < ratio.getFEdges().size(); i++) {
            auto index_iter = std::lower_bound(t2_edges.begin(), t2_edges.end(), ratio_f_edges[i]);
            bVertices.push_back(std::distance(t2_edges.begin(), index_iter));
        }

        // get the cover
        auto cover = bg.vertex_cover(aVertices, bVertices);
        // check if cover is trivial
        if ((cover[0][0] == 0) || (cover[0][0] == aVertices.size())) {
            // add ratio to geodesic
            rs.push_back(ratio);


        } else {  // cover not trivial
            // make two new ratios
            auto r1 = Ratio();
            auto r2 = Ratio();

            int j = 0;  // for index in cover array

            // split the ratio based on the cover
            for (unsigned long aVertex : aVertices) {
                if ((j < cover[2].size()) && (aVertex == cover[2][j])) {
                    r1.addEEdge(t1_edges[aVertex]);
                    j++;
                } else { // the split is not in the cover, and hence dropped first
                    r2.addEEdge(t1_edges[aVertex]);
                }
            }

            j = 0;   // reset index
            // split the ratio based on the cover
            for (unsigned long bVertex : bVertices) {
                if ((j < cover[3].size()) && (bVertex == cover[3][j])) {
                    r2.addFEdge(t2_edges[bVertex]);
                    j++;
                } else { // the split is not in the cover, and hence dropped first
                    r1.addFEdge(t2_edges[bVertex]);
                }
            }

            // add ratios to the queue
            queue.push_front(r2);
            queue.push_front(r1);
        }
    }
    return Geodesic(rs);
}